

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O0

char * test_database_path(char *filename)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 in_R9;
  char *path;
  char *UNUSED_tmp;
  char cwd [500];
  char *local_18;
  char *test_db_dir;
  char *filename_local;
  
  pcVar2 = getcwd((char *)&UNUSED_tmp,500);
  pcVar3 = __xpg_basename((char *)&UNUSED_tmp);
  iVar1 = strcmp(pcVar3,"t");
  if (iVar1 == 0) {
    local_18 = "./maxmind-db/test-data";
  }
  else {
    local_18 = "./t/maxmind-db/test-data";
  }
  pcVar3 = (char *)malloc(500);
  if (pcVar3 != (char *)0x0) {
    snprintf(pcVar3,500,"%s/%s",local_18,filename,in_R9,pcVar3,pcVar2);
    return pcVar3;
  }
  __assert_fail("NULL != path",
                "/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/maxminddb_test_helper.c"
                ,0x42,"char *test_database_path(const char *)");
}

Assistant:

char *test_database_path(const char *filename) {
    char *test_db_dir;
#ifdef _WIN32
    test_db_dir = "../t/maxmind-db/test-data";
#else
    char cwd[500];
    char *UNUSED(tmp) = getcwd(cwd, 500);

    if (strcmp(basename(cwd), "t") == 0) {
        test_db_dir = "./maxmind-db/test-data";
    } else {
        test_db_dir = "./t/maxmind-db/test-data";
    }
#endif

    char *path = malloc(500);
    assert(NULL != path);

    snprintf(path, 500, "%s/%s", test_db_dir, filename);

    return path;
}